

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

char * __thiscall kj::ExceptionImpl::what(ExceptionImpl *this)

{
  char *pcVar1;
  ExceptionImpl *in_RDX;
  Array<char> local_20;
  
  str<kj::ExceptionImpl_const&>((String *)&local_20,(kj *)this,in_RDX);
  Array<char>::operator=(&(this->whatBuffer).content,&local_20);
  Array<char>::~Array(&local_20);
  pcVar1 = (char *)(this->whatBuffer).content.size_;
  if (pcVar1 != (char *)0x0) {
    pcVar1 = (this->whatBuffer).content.ptr;
  }
  return pcVar1;
}

Assistant:

const char* ExceptionImpl::what() const noexcept {
  whatBuffer = str(*this);
  return whatBuffer.begin();
}